

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

int __thiscall MovParsedH264TrackData::getNalSize(MovParsedH264TrackData *this,uint8_t *buff)

{
  ostream *poVar1;
  VodCoreException *this_00;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  uint8_t *buff_local;
  MovParsedH264TrackData *this_local;
  
  if (this->nal_length_size == '\x01') {
    this_local._4_4_ = (uint)*buff;
  }
  else if (this->nal_length_size == '\x02') {
    this_local._4_4_ = (uint)*buff * 0x100 + (uint)buff[1];
  }
  else if (this->nal_length_size == '\x03') {
    this_local._4_4_ = (uint)*buff * 0x10000 + (uint)buff[1] * 0x100 + (uint)buff[2];
  }
  else {
    if (this->nal_length_size != '\x04') {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar1 = std::operator<<((ostream *)local_198,
                               "MP4/MOV error: Unsupported H.264/AVC frame length field value ");
      std::operator<<(poVar1,this->nal_length_size);
      this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_00,0x3b6,&local_1c8);
      __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    this_local._4_4_ =
         (uint)*buff * 0x1000000 + (uint)buff[1] * 0x10000 + (uint)buff[2] * 0x100 + (uint)buff[3];
  }
  return this_local._4_4_;
}

Assistant:

int getNalSize(const uint8_t* buff) const
    {
        if (nal_length_size == 1)
            return buff[0];
        if (nal_length_size == 2)
            return (buff[0] << 8) + buff[1];
        if (nal_length_size == 3)
            return (buff[0] << 16) + (buff[1] << 8) + buff[2];
        if (nal_length_size == 4)
            return (buff[0] << 24) + (buff[1] << 16) + (buff[2] << 8) + buff[3];

        THROW(ERR_MOV_PARSE, "MP4/MOV error: Unsupported H.264/AVC frame length field value " << nal_length_size)
    }